

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall Heap<4U>::Heap_Up(Heap<4U> *this,uint32_t i)

{
  uint uVar1;
  mapped_type *__b;
  uint in_ESI;
  long *in_RDI;
  uint32_t parent;
  Counter *in_stack_ffffffffffffffd8;
  Counter *in_stack_ffffffffffffffe0;
  uint local_c;
  
  local_c = in_ESI;
  while ((1 < local_c &&
         (uVar1 = local_c - 1 >> 1,
         *(int *)(*in_RDI + 4 + (ulong)local_c * 8) < *(int *)(*in_RDI + 4 + (ulong)uVar1 * 8)))) {
    std::swap<Heap<4u>::Counter>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 =
         (Counter *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                       *)in_stack_ffffffffffffffe0,&in_stack_ffffffffffffffd8->item);
    __b = std::
          unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
          ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                        *)in_stack_ffffffffffffffe0,&in_stack_ffffffffffffffd8->item);
    std::swap<int>((int *)in_stack_ffffffffffffffe0,__b);
    local_c = uVar1;
  }
  return;
}

Assistant:

void Heap_Up(uint32_t i) {
		while (i > 1) {
			uint32_t parent = (i - 1) / 2;
			if (heaps[parent].counter <= heaps[i].counter) {
				break;
			}
			std::swap(heaps[i], heaps[parent]);
			std::swap(mp[heaps[i].item], mp[heaps[parent].item]);
			i = parent;
		}
	}